

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  RTCRayQueryFlags RVar2;
  RTCIntersectArguments *pRVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [24];
  undefined1 auVar62 [24];
  RTCIntersectArguments *pRVar63;
  bool bVar64;
  int iVar65;
  long lVar66;
  undefined4 uVar67;
  size_t *psVar68;
  ulong uVar69;
  ulong uVar70;
  NodeRef root;
  long lVar71;
  undefined1 (*pauVar72) [32];
  undefined1 auVar74 [16];
  float fVar73;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar85;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar83;
  float fVar84;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 in_ZMM0 [64];
  undefined1 auVar90 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar101 [32];
  undefined1 auVar100 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar99;
  float fVar115;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar113;
  float fVar114;
  float fVar116;
  float fVar117;
  undefined1 auVar112 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar123;
  undefined1 auVar124 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar133;
  float fVar134;
  undefined1 auVar135 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar156;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar166 [32];
  float fVar173;
  uint uVar174;
  float fVar177;
  uint uVar178;
  float fVar179;
  uint uVar180;
  float fVar181;
  uint uVar182;
  float fVar183;
  uint uVar184;
  float fVar185;
  uint uVar186;
  float fVar187;
  uint uVar188;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  uint uVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  float fVar194;
  undefined1 auVar193 [64];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 in_ZMM15 [64];
  Precalculations pre;
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d29;
  BVH *local_5d28;
  undefined1 local_5d20 [32];
  RayK<8> *local_5d00;
  Intersectors *local_5cf8;
  RayQueryContext *local_5cf0;
  RayK<8> *local_5ce8;
  undefined1 local_5ce0 [20];
  uint uStack_5ccc;
  uint uStack_5cc8;
  uint uStack_5cc4;
  undefined1 local_5cc0 [32];
  uint local_5ca0;
  undefined4 uStack_5c9c;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  size_t local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  RTCIntersectArguments *local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined1 local_5c40 [8];
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  float fStack_5c24;
  undefined1 local_5c20 [8];
  float fStack_5c18;
  float fStack_5c14;
  float fStack_5c10;
  float fStack_5c0c;
  float fStack_5c08;
  float fStack_5c04;
  undefined1 local_5c00 [8];
  float fStack_5bf8;
  float fStack_5bf4;
  float fStack_5bf0;
  float fStack_5bec;
  float fStack_5be8;
  float fStack_5be4;
  undefined1 local_5be0 [8];
  float fStack_5bd8;
  float fStack_5bd4;
  float fStack_5bd0;
  float fStack_5bcc;
  float fStack_5bc8;
  float fStack_5bc4;
  undefined1 local_5bc0 [8];
  float fStack_5bb8;
  float fStack_5bb4;
  float fStack_5bb0;
  float fStack_5bac;
  float fStack_5ba8;
  float fStack_5ba4;
  undefined1 local_5b90 [16];
  undefined1 local_5b80 [16];
  undefined1 local_5b70 [16];
  undefined8 local_5b60;
  undefined8 uStack_5b58;
  undefined8 uStack_5b50;
  undefined8 uStack_5b48;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  undefined8 local_5b20;
  undefined8 uStack_5b18;
  undefined8 uStack_5b10;
  undefined8 uStack_5b08;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined8 local_5ae0;
  undefined8 uStack_5ad8;
  undefined8 uStack_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5aa0;
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [8];
  float fStack_59d8;
  float fStack_59d4;
  float fStack_59d0;
  float fStack_59cc;
  float fStack_59c8;
  undefined1 local_59c0 [8];
  float fStack_59b8;
  float fStack_59b4;
  float fStack_59b0;
  float fStack_59ac;
  float fStack_59a8;
  undefined1 local_59a0 [8];
  float fStack_5998;
  float fStack_5994;
  float fStack_5990;
  float fStack_598c;
  float fStack_5988;
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined4 local_5880;
  undefined4 uStack_587c;
  uint uStack_5878;
  uint uStack_5874;
  uint uStack_5870;
  uint uStack_586c;
  uint uStack_5868;
  uint uStack_5864;
  undefined1 local_5860 [32];
  float local_5840;
  float fStack_583c;
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  float fStack_5824;
  undefined8 local_5810;
  size_t local_5808 [561];
  undefined4 local_4680;
  undefined4 uStack_467c;
  undefined4 uStack_4678;
  undefined4 uStack_4674;
  undefined4 uStack_4670;
  undefined4 uStack_466c;
  undefined4 uStack_4668;
  undefined4 uStack_4664;
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar195 [36];
  
  local_5d28 = (BVH *)This->ptr;
  local_5808[0] = (local_5d28->root).ptr;
  if (local_5808[0] != 8) {
    local_5c60 = (RTCIntersectArguments *)ray;
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       (local_5c60 = context->args,
       (local_5c60->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar192 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar190 = vpcmpeqd_avx(auVar192,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
      auVar192 = vpcmpeqd_avx(auVar192,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
      auVar89 = ZEXT816(0) << 0x40;
      auVar95 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar89),5);
      auVar119._16_16_ = auVar192;
      auVar119._0_16_ = auVar190;
      auVar91 = auVar119 & auVar95;
      if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar91 >> 0x7f,0) != '\0') ||
            (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar91 >> 0xbf,0) != '\0') ||
          (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar91[0x1f] < '\0') {
        local_58c0 = vandps_avx(auVar95,auVar119);
        local_5aa0._0_8_ = *(undefined8 *)ray;
        local_5aa0._8_8_ = *(undefined8 *)(ray + 8);
        local_5aa0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5aa0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5aa0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5aa0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5aa0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5aa0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5aa0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5aa0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5aa0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5aa0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5a40 = *(undefined1 (*) [32])(ray + 0x80);
        local_5a20 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5a00 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar153._8_4_ = 0x7fffffff;
        auVar153._0_8_ = 0x7fffffff7fffffff;
        auVar153._12_4_ = 0x7fffffff;
        auVar153._16_4_ = 0x7fffffff;
        auVar153._20_4_ = 0x7fffffff;
        auVar153._24_4_ = 0x7fffffff;
        auVar153._28_4_ = 0x7fffffff;
        auVar136._8_4_ = 0x219392ef;
        auVar136._0_8_ = 0x219392ef219392ef;
        auVar136._12_4_ = 0x219392ef;
        auVar136._16_4_ = 0x219392ef;
        auVar136._20_4_ = 0x219392ef;
        auVar136._24_4_ = 0x219392ef;
        auVar136._28_4_ = 0x219392ef;
        auVar95 = vandps_avx(auVar153,local_5a40);
        auVar95 = vcmpps_avx(auVar95,auVar136,1);
        auVar91 = vblendvps_avx(local_5a40,auVar136,auVar95);
        auVar95 = vandps_avx(auVar153,local_5a20);
        auVar95 = vcmpps_avx(auVar95,auVar136,1);
        auVar119 = vblendvps_avx(local_5a20,auVar136,auVar95);
        auVar95 = vandps_avx(auVar153,local_5a00);
        auVar95 = vcmpps_avx(auVar95,auVar136,1);
        auVar95 = vblendvps_avx(local_5a00,auVar136,auVar95);
        auVar19 = vrcpps_avx(auVar91);
        fVar4 = auVar19._0_4_;
        fVar5 = auVar19._4_4_;
        auVar20._4_4_ = auVar91._4_4_ * fVar5;
        auVar20._0_4_ = auVar91._0_4_ * fVar4;
        fVar6 = auVar19._8_4_;
        auVar20._8_4_ = auVar91._8_4_ * fVar6;
        fVar9 = auVar19._12_4_;
        auVar20._12_4_ = auVar91._12_4_ * fVar9;
        fVar11 = auVar19._16_4_;
        auVar20._16_4_ = auVar91._16_4_ * fVar11;
        fVar13 = auVar19._20_4_;
        auVar20._20_4_ = auVar91._20_4_ * fVar13;
        fVar15 = auVar19._24_4_;
        auVar20._24_4_ = auVar91._24_4_ * fVar15;
        auVar20._28_4_ = auVar91._28_4_;
        auVar146._8_4_ = 0x3f800000;
        auVar146._0_8_ = 0x3f8000003f800000;
        auVar146._12_4_ = 0x3f800000;
        auVar146._16_4_ = 0x3f800000;
        auVar146._20_4_ = 0x3f800000;
        auVar146._24_4_ = 0x3f800000;
        auVar146._28_4_ = 0x3f800000;
        auVar91 = vsubps_avx(auVar146,auVar20);
        local_59e0._0_4_ = fVar4 + fVar4 * auVar91._0_4_;
        local_59e0._4_4_ = fVar5 + fVar5 * auVar91._4_4_;
        fStack_59d8 = fVar6 + fVar6 * auVar91._8_4_;
        fStack_59d4 = fVar9 + fVar9 * auVar91._12_4_;
        fStack_59d0 = fVar11 + fVar11 * auVar91._16_4_;
        fStack_59cc = fVar13 + fVar13 * auVar91._20_4_;
        fStack_59c8 = fVar15 + fVar15 * auVar91._24_4_;
        register0x0000129c = auVar19._28_4_ + auVar91._28_4_;
        auVar91 = vrcpps_avx(auVar119);
        fVar4 = auVar91._0_4_;
        fVar5 = auVar91._4_4_;
        auVar19._4_4_ = auVar119._4_4_ * fVar5;
        auVar19._0_4_ = auVar119._0_4_ * fVar4;
        fVar6 = auVar91._8_4_;
        auVar19._8_4_ = auVar119._8_4_ * fVar6;
        fVar9 = auVar91._12_4_;
        auVar19._12_4_ = auVar119._12_4_ * fVar9;
        fVar11 = auVar91._16_4_;
        auVar19._16_4_ = auVar119._16_4_ * fVar11;
        fVar13 = auVar91._20_4_;
        auVar19._20_4_ = auVar119._20_4_ * fVar13;
        fVar15 = auVar91._24_4_;
        auVar19._24_4_ = auVar119._24_4_ * fVar15;
        auVar19._28_4_ = auVar119._28_4_;
        auVar119 = vsubps_avx(auVar146,auVar19);
        local_59c0._0_4_ = fVar4 + fVar4 * auVar119._0_4_;
        local_59c0._4_4_ = fVar5 + fVar5 * auVar119._4_4_;
        fStack_59b8 = fVar6 + fVar6 * auVar119._8_4_;
        fStack_59b4 = fVar9 + fVar9 * auVar119._12_4_;
        fStack_59b0 = fVar11 + fVar11 * auVar119._16_4_;
        fStack_59ac = fVar13 + fVar13 * auVar119._20_4_;
        fStack_59a8 = fVar15 + fVar15 * auVar119._24_4_;
        register0x000012dc = auVar91._28_4_ + auVar119._28_4_;
        auVar91 = vrcpps_avx(auVar95);
        fVar4 = auVar91._0_4_;
        fVar5 = auVar91._4_4_;
        auVar21._4_4_ = auVar95._4_4_ * fVar5;
        auVar21._0_4_ = auVar95._0_4_ * fVar4;
        fVar6 = auVar91._8_4_;
        auVar21._8_4_ = auVar95._8_4_ * fVar6;
        fVar9 = auVar91._12_4_;
        auVar21._12_4_ = auVar95._12_4_ * fVar9;
        fVar11 = auVar91._16_4_;
        auVar21._16_4_ = auVar95._16_4_ * fVar11;
        fVar13 = auVar91._20_4_;
        auVar21._20_4_ = auVar95._20_4_ * fVar13;
        fVar15 = auVar91._24_4_;
        auVar21._24_4_ = auVar95._24_4_ * fVar15;
        auVar21._28_4_ = auVar95._28_4_;
        auVar95 = vsubps_avx(auVar146,auVar21);
        local_59a0._0_4_ = fVar4 + fVar4 * auVar95._0_4_;
        local_59a0._4_4_ = fVar5 + fVar5 * auVar95._4_4_;
        fStack_5998 = fVar6 + fVar6 * auVar95._8_4_;
        fStack_5994 = fVar9 + fVar9 * auVar95._12_4_;
        fStack_5990 = fVar11 + fVar11 * auVar95._16_4_;
        fStack_598c = fVar13 + fVar13 * auVar95._20_4_;
        fStack_5988 = fVar15 + fVar15 * auVar95._24_4_;
        register0x0000131c = auVar91._28_4_ + auVar95._28_4_;
        auVar91._8_4_ = 0x20;
        auVar91._0_8_ = 0x2000000020;
        auVar91._12_4_ = 0x20;
        auVar91._16_4_ = 0x20;
        auVar91._20_4_ = 0x20;
        auVar91._24_4_ = 0x20;
        auVar91._28_4_ = 0x20;
        auVar95 = vcmpps_avx(_local_59e0,ZEXT1632(auVar89),1);
        local_5980 = vandps_avx(auVar95,auVar91);
        auVar91 = ZEXT1632(auVar89);
        auVar95 = vcmpps_avx(_local_59c0,auVar91,5);
        auVar120._8_4_ = 0x40;
        auVar120._0_8_ = 0x4000000040;
        auVar120._12_4_ = 0x40;
        auVar120._16_4_ = 0x40;
        auVar120._20_4_ = 0x40;
        auVar120._24_4_ = 0x40;
        auVar120._28_4_ = 0x40;
        auVar137._8_4_ = 0x60;
        auVar137._0_8_ = 0x6000000060;
        auVar137._12_4_ = 0x60;
        auVar137._16_4_ = 0x60;
        auVar137._20_4_ = 0x60;
        auVar137._24_4_ = 0x60;
        auVar137._28_4_ = 0x60;
        local_5960 = vblendvps_avx(auVar137,auVar120,auVar95);
        auVar95 = vcmpps_avx(_local_59a0,auVar91,5);
        auVar121._8_4_ = 0x80;
        auVar121._0_8_ = 0x8000000080;
        auVar121._12_4_ = 0x80;
        auVar121._16_4_ = 0x80;
        auVar121._20_4_ = 0x80;
        auVar121._24_4_ = 0x80;
        auVar121._28_4_ = 0x80;
        auVar125._8_4_ = 0xa0;
        auVar125._0_8_ = 0xa0000000a0;
        auVar125._12_4_ = 0xa0;
        auVar125._16_4_ = 0xa0;
        auVar125._20_4_ = 0xa0;
        auVar125._24_4_ = 0xa0;
        auVar125._28_4_ = 0xa0;
        local_5940 = vblendvps_avx(auVar125,auVar121,auVar95);
        auVar95 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar91);
        auVar91 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar91);
        auVar75._8_4_ = 0x7f800000;
        auVar75._0_8_ = 0x7f8000007f800000;
        auVar75._12_4_ = 0x7f800000;
        auVar75._16_4_ = 0x7f800000;
        auVar75._20_4_ = 0x7f800000;
        auVar75._24_4_ = 0x7f800000;
        auVar75._28_4_ = 0x7f800000;
        local_5920 = vblendvps_avx(auVar75,auVar95,local_58c0);
        auVar95._8_4_ = 0xff800000;
        auVar95._0_8_ = 0xff800000ff800000;
        auVar95._12_4_ = 0xff800000;
        auVar95._16_4_ = 0xff800000;
        auVar95._20_4_ = 0xff800000;
        auVar95._24_4_ = 0xff800000;
        auVar95._28_4_ = 0xff800000;
        auVar112 = ZEXT3264(auVar95);
        local_5900 = vblendvps_avx(auVar95,auVar91,local_58c0);
        auVar95 = vcmpps_avx(local_5900,local_5900,0xf);
        local_5ce0._4_4_ = local_58c0._4_4_ ^ auVar95._4_4_;
        local_5ce0._0_4_ = local_58c0._0_4_ ^ auVar95._0_4_;
        local_5ce0._8_4_ = local_58c0._8_4_ ^ auVar95._8_4_;
        local_5ce0._12_4_ = local_58c0._12_4_ ^ auVar95._12_4_;
        local_5ce0._16_4_ = local_58c0._16_4_ ^ auVar95._16_4_;
        uStack_5ccc = local_58c0._20_4_ ^ auVar95._20_4_;
        uStack_5cc8 = local_58c0._24_4_ ^ auVar95._24_4_;
        uStack_5cc4 = local_58c0._28_4_ ^ auVar95._28_4_;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar70 = 7;
        }
        else {
          local_5c60 = (RTCIntersectArguments *)
                       (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT);
          uVar70 = (long)local_5c60 * 5 + 2;
        }
        local_5ce8 = ray + 0x100;
        psVar68 = local_5808 + 1;
        local_5810 = 0xfffffffffffffff8;
        pauVar72 = (undefined1 (*) [32])local_4640;
        local_4680 = 0x7f800000;
        uStack_467c = 0x7f800000;
        uStack_4678 = 0x7f800000;
        uStack_4674 = 0x7f800000;
        uStack_4670 = 0x7f800000;
        uStack_466c = 0x7f800000;
        uStack_4668 = 0x7f800000;
        uStack_4664 = 0x7f800000;
        local_4660 = local_5920;
        local_5cf8 = This;
        local_5d00 = ray;
        local_5cf0 = context;
LAB_0102839e:
        do {
          do {
            root.ptr = psVar68[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01028f00;
            psVar68 = psVar68 + -1;
            pauVar72 = pauVar72 + -1;
            local_5d20 = *pauVar72;
            auVar98 = ZEXT3264(local_5d20);
            auVar95 = vcmpps_avx(local_5d20,local_5900,1);
          } while ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar95 >> 0x7f,0) == '\0') &&
                     (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar95 >> 0xbf,0) == '\0') &&
                   (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar95[0x1f]);
          uVar67 = vmovmskps_avx(auVar95);
          local_5c60 = (RTCIntersectArguments *)CONCAT44((int)((ulong)local_5c60 >> 0x20),uVar67);
          local_5ca0 = POPCOUNT(uVar67);
          if (uVar70 < local_5ca0) {
LAB_010283db:
            do {
              if ((root.ptr & 8) != 0) {
                if ((RTCIntersectArguments *)root.ptr ==
                    (RTCIntersectArguments *)&DAT_fffffffffffffff8) goto LAB_01028f00;
                local_58a0 = local_5900;
                auVar95 = vcmpps_avx(local_5900,auVar98._0_32_,6);
                if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar95 >> 0x7f,0) == '\0') &&
                      (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar95 >> 0xbf,0) == '\0') &&
                    (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar95[0x1f]) goto LAB_0102839e;
                local_5880 = local_5ce0._0_4_;
                uStack_587c = local_5ce0._4_4_;
                uStack_5878 = local_5ce0._8_4_;
                uStack_5874 = local_5ce0._12_4_;
                uStack_5870 = local_5ce0._16_4_;
                uStack_586c = uStack_5ccc;
                uStack_5868 = uStack_5cc8;
                uStack_5864 = uStack_5cc4;
                local_5cc0._0_8_ = local_5ce0._0_8_ ^ 0xffffffffffffffff;
                local_5cc0._8_4_ = local_5ce0._8_4_ ^ 0xffffffff;
                local_5cc0._12_4_ = local_5ce0._12_4_ ^ 0xffffffff;
                local_5cc0._16_4_ = local_5ce0._16_4_ ^ 0xffffffff;
                local_5cc0._20_4_ = uStack_5ccc ^ 0xffffffff;
                local_5cc0._24_4_ = uStack_5cc8 ^ 0xffffffff;
                local_5cc0._28_4_ = uStack_5cc4 ^ 0xffffffff;
                uStack_5c58 = *(undefined8 *)(local_5d00 + 8);
                uStack_5c50 = *(undefined8 *)(local_5d00 + 0x10);
                uStack_5c48 = *(undefined8 *)(local_5d00 + 0x18);
                uStack_5c78 = *(undefined8 *)(local_5d00 + 0x28);
                uStack_5c70 = *(undefined8 *)(local_5d00 + 0x30);
                uStack_5c68 = *(undefined8 *)(local_5d00 + 0x38);
                uStack_5c98 = *(undefined8 *)(local_5d00 + 0x48);
                uStack_5c90 = *(undefined8 *)(local_5d00 + 0x50);
                uStack_5c88 = *(undefined8 *)(local_5d00 + 0x58);
                uVar44 = *(undefined8 *)(local_5d00 + 0x60);
                uVar45 = *(undefined8 *)(local_5d00 + 0x68);
                uVar46 = *(undefined8 *)(local_5d00 + 0x70);
                uStack_5b08 = *(undefined8 *)(local_5d00 + 0x78);
                uVar47 = *(undefined8 *)(local_5d00 + 0xa0);
                uVar48 = *(undefined8 *)(local_5d00 + 0xa8);
                uVar49 = *(undefined8 *)(local_5d00 + 0xb0);
                uVar50 = *(undefined8 *)(local_5d00 + 0xb8);
                uVar51 = *(undefined8 *)(local_5d00 + 0xc0);
                uVar52 = *(undefined8 *)(local_5d00 + 200);
                uVar53 = *(undefined8 *)(local_5d00 + 0xd0);
                uStack_5ac8 = *(undefined8 *)(local_5d00 + 0xd8);
                pRVar1 = local_5d00 + 0x80;
                local_5b00 = *(undefined8 *)pRVar1;
                uStack_5af8 = *(undefined8 *)(local_5d00 + 0x88);
                uStack_5af0 = *(undefined8 *)(local_5d00 + 0x90);
                auVar62 = *(undefined1 (*) [24])pRVar1;
                auVar61 = *(undefined1 (*) [24])pRVar1;
                uStack_5ae8 = *(undefined8 *)(local_5d00 + 0x98);
                uVar54 = *(undefined8 *)(local_5d00 + 0x100);
                uVar55 = *(undefined8 *)(local_5d00 + 0x108);
                uVar56 = *(undefined8 *)(local_5d00 + 0x110);
                uStack_5b28 = *(undefined8 *)(local_5d00 + 0x118);
                pRVar1 = local_5d00 + 0x120;
                local_5b60 = *(undefined8 *)pRVar1;
                uStack_5b58 = *(undefined8 *)(local_5d00 + 0x128);
                uStack_5b50 = *(undefined8 *)(local_5d00 + 0x130);
                uStack_5b48 = *(undefined8 *)(local_5d00 + 0x138);
                lVar71 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                lVar66 = 0;
                goto LAB_0102870e;
              }
              auVar92._8_4_ = 0x7f800000;
              auVar92._0_8_ = 0x7f8000007f800000;
              auVar92._12_4_ = 0x7f800000;
              auVar92._16_4_ = 0x7f800000;
              auVar92._20_4_ = 0x7f800000;
              auVar92._24_4_ = 0x7f800000;
              auVar92._28_4_ = 0x7f800000;
              local_5c60 = (RTCIntersectArguments *)0x8;
              for (lVar66 = 0;
                  (auVar98 = ZEXT3264(auVar92), lVar66 != 8 &&
                  (pRVar3 = *(RTCIntersectArguments **)
                             ((root.ptr & 0xfffffffffffffff0) + lVar66 * 8),
                  pRVar3 != (RTCIntersectArguments *)0x8)); lVar66 = lVar66 + 1) {
                RVar2 = (&((RTCIntersectArguments *)(root.ptr + 0x40))->flags)[lVar66];
                auVar76._4_4_ = RVar2;
                auVar76._0_4_ = RVar2;
                auVar76._8_4_ = RVar2;
                auVar76._12_4_ = RVar2;
                auVar76._16_4_ = RVar2;
                auVar76._20_4_ = RVar2;
                auVar76._24_4_ = RVar2;
                auVar76._28_4_ = RVar2;
                auVar57._8_8_ = local_5aa0._8_8_;
                auVar57._0_8_ = local_5aa0._0_8_;
                auVar57._16_8_ = local_5aa0._16_8_;
                auVar57._24_8_ = local_5aa0._24_8_;
                auVar58._8_8_ = local_5aa0._40_8_;
                auVar58._0_8_ = local_5aa0._32_8_;
                auVar58._16_8_ = local_5aa0._48_8_;
                auVar58._24_8_ = local_5aa0._56_8_;
                auVar59._8_8_ = local_5aa0._72_8_;
                auVar59._0_8_ = local_5aa0._64_8_;
                auVar59._16_8_ = local_5aa0._80_8_;
                auVar59._24_8_ = local_5aa0._88_8_;
                auVar95 = vsubps_avx(auVar76,auVar57);
                auVar74._0_4_ = (float)local_59e0._0_4_ * auVar95._0_4_;
                auVar74._4_4_ = (float)local_59e0._4_4_ * auVar95._4_4_;
                auVar74._8_4_ = fStack_59d8 * auVar95._8_4_;
                auVar74._12_4_ = fStack_59d4 * auVar95._12_4_;
                auVar22._16_4_ = fStack_59d0 * auVar95._16_4_;
                auVar22._0_16_ = auVar74;
                auVar22._20_4_ = fStack_59cc * auVar95._20_4_;
                auVar22._24_4_ = fStack_59c8 * auVar95._24_4_;
                auVar22._28_4_ = auVar95._28_4_;
                RVar2 = (&((RTCIntersectArguments *)(root.ptr + 0x80))->flags)[lVar66];
                auVar93._4_4_ = RVar2;
                auVar93._0_4_ = RVar2;
                auVar93._8_4_ = RVar2;
                auVar93._12_4_ = RVar2;
                auVar93._16_4_ = RVar2;
                auVar93._20_4_ = RVar2;
                auVar93._24_4_ = RVar2;
                auVar93._28_4_ = RVar2;
                auVar95 = vsubps_avx(auVar93,auVar58);
                auVar90._0_4_ = (float)local_59c0._0_4_ * auVar95._0_4_;
                auVar90._4_4_ = (float)local_59c0._4_4_ * auVar95._4_4_;
                auVar90._8_4_ = fStack_59b8 * auVar95._8_4_;
                auVar90._12_4_ = fStack_59b4 * auVar95._12_4_;
                auVar23._16_4_ = fStack_59b0 * auVar95._16_4_;
                auVar23._0_16_ = auVar90;
                auVar23._20_4_ = fStack_59ac * auVar95._20_4_;
                auVar23._24_4_ = fStack_59a8 * auVar95._24_4_;
                auVar23._28_4_ = auVar95._28_4_;
                RVar2 = (&((RTCIntersectArguments *)(root.ptr + 0xc0))->flags)[lVar66];
                auVar101._4_4_ = RVar2;
                auVar101._0_4_ = RVar2;
                auVar101._8_4_ = RVar2;
                auVar101._12_4_ = RVar2;
                auVar101._16_4_ = RVar2;
                auVar101._20_4_ = RVar2;
                auVar101._24_4_ = RVar2;
                auVar101._28_4_ = RVar2;
                auVar95 = vsubps_avx(auVar101,auVar59);
                auVar100._0_4_ = (float)local_59a0._0_4_ * auVar95._0_4_;
                auVar100._4_4_ = (float)local_59a0._4_4_ * auVar95._4_4_;
                auVar100._8_4_ = fStack_5998 * auVar95._8_4_;
                auVar100._12_4_ = fStack_5994 * auVar95._12_4_;
                auVar24._16_4_ = fStack_5990 * auVar95._16_4_;
                auVar24._0_16_ = auVar100;
                auVar24._20_4_ = fStack_598c * auVar95._20_4_;
                auVar24._24_4_ = fStack_5988 * auVar95._24_4_;
                auVar24._28_4_ = auVar95._28_4_;
                RVar2 = (&((RTCIntersectArguments *)(root.ptr + 0x60))->flags)[lVar66];
                auVar157._4_4_ = RVar2;
                auVar157._0_4_ = RVar2;
                auVar157._8_4_ = RVar2;
                auVar157._12_4_ = RVar2;
                auVar157._16_4_ = RVar2;
                auVar157._20_4_ = RVar2;
                auVar157._24_4_ = RVar2;
                auVar157._28_4_ = RVar2;
                auVar95 = vsubps_avx(auVar157,auVar57);
                auVar118._0_4_ = (float)local_59e0._0_4_ * auVar95._0_4_;
                auVar118._4_4_ = (float)local_59e0._4_4_ * auVar95._4_4_;
                auVar118._8_4_ = fStack_59d8 * auVar95._8_4_;
                auVar118._12_4_ = fStack_59d4 * auVar95._12_4_;
                auVar25._16_4_ = fStack_59d0 * auVar95._16_4_;
                auVar25._0_16_ = auVar118;
                auVar25._20_4_ = fStack_59cc * auVar95._20_4_;
                auVar25._24_4_ = fStack_59c8 * auVar95._24_4_;
                auVar25._28_4_ = auVar95._28_4_;
                RVar2 = (&((RTCIntersectArguments *)(root.ptr + 0xa0))->flags)[lVar66];
                auVar147._4_4_ = RVar2;
                auVar147._0_4_ = RVar2;
                auVar147._8_4_ = RVar2;
                auVar147._12_4_ = RVar2;
                auVar147._16_4_ = RVar2;
                auVar147._20_4_ = RVar2;
                auVar147._24_4_ = RVar2;
                auVar147._28_4_ = RVar2;
                auVar95 = vsubps_avx(auVar147,auVar58);
                auVar124._0_4_ = (float)local_59c0._0_4_ * auVar95._0_4_;
                auVar124._4_4_ = (float)local_59c0._4_4_ * auVar95._4_4_;
                auVar124._8_4_ = fStack_59b8 * auVar95._8_4_;
                auVar124._12_4_ = fStack_59b4 * auVar95._12_4_;
                auVar26._16_4_ = fStack_59b0 * auVar95._16_4_;
                auVar26._0_16_ = auVar124;
                auVar26._20_4_ = fStack_59ac * auVar95._20_4_;
                auVar26._24_4_ = fStack_59a8 * auVar95._24_4_;
                auVar26._28_4_ = auVar95._28_4_;
                RVar2 = (&((RTCIntersectArguments *)(root.ptr + 0xe0))->flags)[lVar66];
                auVar148._4_4_ = RVar2;
                auVar148._0_4_ = RVar2;
                auVar148._8_4_ = RVar2;
                auVar148._12_4_ = RVar2;
                auVar148._16_4_ = RVar2;
                auVar148._20_4_ = RVar2;
                auVar148._24_4_ = RVar2;
                auVar148._28_4_ = RVar2;
                auVar95 = vsubps_avx(auVar148,auVar59);
                auVar135._0_4_ = (float)local_59a0._0_4_ * auVar95._0_4_;
                auVar135._4_4_ = (float)local_59a0._4_4_ * auVar95._4_4_;
                auVar135._8_4_ = fStack_5998 * auVar95._8_4_;
                auVar135._12_4_ = fStack_5994 * auVar95._12_4_;
                auVar27._16_4_ = fStack_5990 * auVar95._16_4_;
                auVar27._0_16_ = auVar135;
                auVar27._20_4_ = fStack_598c * auVar95._20_4_;
                auVar27._24_4_ = fStack_5988 * auVar95._24_4_;
                auVar27._28_4_ = auVar95._28_4_;
                auVar192 = vpminsd_avx(auVar22._16_16_,auVar25._16_16_);
                auVar190 = vpminsd_avx(auVar74,auVar118);
                auVar89 = vpminsd_avx(auVar23._16_16_,auVar26._16_16_);
                auVar192 = vpmaxsd_avx(auVar192,auVar89);
                auVar89 = vpminsd_avx(auVar90,auVar124);
                auVar190 = vpmaxsd_avx(auVar190,auVar89);
                auVar89 = vpminsd_avx(auVar100,auVar135);
                auVar190 = vpmaxsd_avx(auVar190,auVar89);
                auVar89 = vpminsd_avx(auVar24._16_16_,auVar27._16_16_);
                auVar192 = vpmaxsd_avx(auVar192,auVar89);
                auVar89 = vpmaxsd_avx(auVar190,local_5920._0_16_);
                auVar17 = vpmaxsd_avx(auVar192,local_5920._16_16_);
                in_ZMM15 = ZEXT1664(auVar17);
                auVar18 = vpmaxsd_avx(auVar22._16_16_,auVar25._16_16_);
                auVar74 = vpmaxsd_avx(auVar74,auVar118);
                auVar118 = vpmaxsd_avx(auVar23._16_16_,auVar26._16_16_);
                auVar118 = vpminsd_avx(auVar18,auVar118);
                auVar18 = vpmaxsd_avx(auVar90,auVar124);
                auVar74 = vpminsd_avx(auVar74,auVar18);
                auVar18 = vpmaxsd_avx(auVar100,auVar135);
                auVar74 = vpminsd_avx(auVar74,auVar18);
                auVar18 = vpmaxsd_avx(auVar24._16_16_,auVar27._16_16_);
                auVar18 = vpminsd_avx(auVar118,auVar18);
                auVar74 = vpminsd_avx(auVar74,local_5900._0_16_);
                auVar18 = vpminsd_avx(auVar18,local_5900._16_16_);
                auVar102._16_16_ = auVar17;
                auVar102._0_16_ = auVar89;
                auVar112 = ZEXT3264(auVar102);
                auVar77._16_16_ = auVar18;
                auVar77._0_16_ = auVar74;
                auVar91 = vcmpps_avx(auVar102,auVar77,2);
                pRVar63 = local_5c60;
                auVar95 = auVar92;
                if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar91 >> 0x7f,0) != '\0') ||
                      (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar91 >> 0xbf,0) != '\0') ||
                    (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar91[0x1f] < '\0') {
                  auVar94._16_16_ = auVar192;
                  auVar94._0_16_ = auVar190;
                  auVar95 = vblendps_avx(auVar94,auVar94,0xf0);
                  auVar103._8_4_ = 0x7f800000;
                  auVar103._0_8_ = 0x7f8000007f800000;
                  auVar103._12_4_ = 0x7f800000;
                  auVar103._16_4_ = 0x7f800000;
                  auVar103._20_4_ = 0x7f800000;
                  auVar103._24_4_ = 0x7f800000;
                  auVar103._28_4_ = 0x7f800000;
                  auVar112 = ZEXT3264(auVar103);
                  auVar95 = vblendvps_avx(auVar103,auVar95,auVar91);
                  pRVar63 = pRVar3;
                  if (local_5c60 != (RTCIntersectArguments *)0x8) {
                    *psVar68 = (size_t)local_5c60;
                    psVar68 = psVar68 + 1;
                    local_5d20._0_8_ = auVar92._0_8_;
                    local_5d20._8_8_ = auVar92._8_8_;
                    local_5d20._16_8_ = auVar92._16_8_;
                    local_5d20._24_8_ = auVar92._24_8_;
                    *(undefined8 *)*pauVar72 = local_5d20._0_8_;
                    *(undefined8 *)(*pauVar72 + 8) = local_5d20._8_8_;
                    *(undefined8 *)(*pauVar72 + 0x10) = local_5d20._16_8_;
                    *(undefined8 *)(*pauVar72 + 0x18) = local_5d20._24_8_;
                    pauVar72 = pauVar72 + 1;
                  }
                }
                auVar92 = auVar95;
                local_5c60 = pRVar63;
              }
              if (local_5c60 == (RTCIntersectArguments *)0x8) goto LAB_01028605;
              auVar95 = vcmpps_avx(local_5900,auVar92,6);
              uVar67 = vmovmskps_avx(auVar95);
              root.ptr = (size_t)local_5c60;
            } while ((byte)uVar70 < (byte)POPCOUNT(uVar67));
            *psVar68 = (size_t)local_5c60;
            psVar68 = psVar68 + 1;
            *pauVar72 = auVar92;
            pauVar72 = pauVar72 + 1;
LAB_01028605:
            iVar65 = 4;
          }
          else {
            uStack_5c9c = 0;
            while (auVar192 = auVar112._0_16_, local_5c60 != (RTCIntersectArguments *)0x0) {
              local_5c80 = 0;
              if (local_5c60 != (RTCIntersectArguments *)0x0) {
                for (; ((ulong)local_5c60 >> local_5c80 & 1) == 0; local_5c80 = local_5c80 + 1) {
                }
              }
              local_5c60 = (RTCIntersectArguments *)
                           ((ulong)local_5c60 & (ulong)((long)&local_5c60[-1].intersect + 7U));
              auVar112 = ZEXT1664(auVar192);
              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
              bVar64 = occluded1(local_5cf8,local_5d28,root,local_5c80,&local_5d29,local_5d00,
                                 (TravRayK<8,_false> *)&local_5aa0.field_0,local_5cf0);
              if (bVar64) {
                *(undefined4 *)(local_5ce0 + local_5c80 * 4) = 0xffffffff;
              }
            }
            auVar192 = vpcmpeqd_avx(auVar192,auVar192);
            auVar190 = vpcmpgtd_avx(stack0xffffffffffffa330,auVar192);
            auVar192 = vpcmpgtd_avx(local_5ce0._0_16_,auVar192);
            auVar112 = ZEXT1664(auVar192);
            auVar192 = vpor_avx(auVar192,auVar190);
            iVar65 = 3;
            if ((((auVar192 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar192 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar192 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar192[0xf] < '\0') {
              auVar111._8_4_ = 0xff800000;
              auVar111._0_8_ = 0xff800000ff800000;
              auVar111._12_4_ = 0xff800000;
              auVar111._16_4_ = 0xff800000;
              auVar111._20_4_ = 0xff800000;
              auVar111._24_4_ = 0xff800000;
              auVar111._28_4_ = 0xff800000;
              auVar112 = ZEXT3264(auVar111);
              local_5900 = vblendvps_avx(local_5900,auVar111,_local_5ce0);
              iVar65 = 2;
            }
            auVar98 = ZEXT3264(local_5d20);
            local_5c60 = (RTCIntersectArguments *)0x0;
            if ((uint)uVar70 < local_5ca0) goto LAB_010283db;
            local_5c60 = (RTCIntersectArguments *)0x0;
          }
        } while (iVar65 != 3);
LAB_01028f00:
        auVar95 = vandps_avx(local_58c0,_local_5ce0);
        auVar97._8_4_ = 0xff800000;
        auVar97._0_8_ = 0xff800000ff800000;
        auVar97._12_4_ = 0xff800000;
        auVar97._16_4_ = 0xff800000;
        auVar97._20_4_ = 0xff800000;
        auVar97._24_4_ = 0xff800000;
        auVar97._28_4_ = 0xff800000;
        auVar95 = vmaskmovps_avx(auVar95,auVar97);
        *(undefined1 (*) [32])local_5ce8 = auVar95;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_0102870e:
  do {
    auVar192 = auVar112._0_16_;
    if (lVar66 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    local_5c60 = (RTCIntersectArguments *)&DAT_fffffffffffffff0;
    auVar112 = ZEXT3264(local_5cc0);
    while ((auVar95 = auVar112._0_32_, local_5c60 != (RTCIntersectArguments *)0x0 &&
           (uVar69 = (ulong)*(uint *)((long)&local_5c60->filter + lVar71), uVar69 != 0xffffffff))) {
      fVar4 = *(float *)(lVar71 + -0xb0 + (long)local_5c60);
      auVar138._4_4_ = fVar4;
      auVar138._0_4_ = fVar4;
      auVar138._8_4_ = fVar4;
      auVar138._12_4_ = fVar4;
      auVar138._16_4_ = fVar4;
      auVar138._20_4_ = fVar4;
      auVar138._24_4_ = fVar4;
      auVar138._28_4_ = fVar4;
      fVar5 = *(float *)((long)&local_5c60[-5].flags + lVar71);
      auVar122._4_4_ = fVar5;
      auVar122._0_4_ = fVar5;
      auVar122._8_4_ = fVar5;
      auVar122._12_4_ = fVar5;
      auVar122._16_4_ = fVar5;
      auVar122._20_4_ = fVar5;
      auVar122._24_4_ = fVar5;
      auVar122._28_4_ = fVar5;
      fVar6 = *(float *)(lVar71 + -0x90 + (long)local_5c60);
      auVar126._4_4_ = fVar6;
      auVar126._0_4_ = fVar6;
      auVar126._8_4_ = fVar6;
      auVar126._12_4_ = fVar6;
      auVar126._16_4_ = fVar6;
      auVar126._20_4_ = fVar6;
      auVar126._24_4_ = fVar6;
      auVar126._28_4_ = fVar6;
      local_5bc0._4_4_ = *(float *)((long)&local_5c60[-4].flags + lVar71);
      local_5be0._4_4_ = *(float *)(lVar71 + -0x70 + (long)local_5c60);
      local_5c00._4_4_ = *(float *)((long)&local_5c60[-3].flags + lVar71);
      local_5c20._4_4_ = *(float *)((long)&local_5c60[-1].flags + lVar71);
      local_5c40._4_4_ = *(float *)(lVar71 + -0x10 + (long)local_5c60);
      local_5840 = *(float *)((long)&local_5c60->flags + lVar71);
      local_5bc0._0_4_ = local_5bc0._4_4_;
      fStack_5bb8 = (float)local_5bc0._4_4_;
      fStack_5bb4 = (float)local_5bc0._4_4_;
      fStack_5bb0 = (float)local_5bc0._4_4_;
      fStack_5bac = (float)local_5bc0._4_4_;
      fStack_5ba8 = (float)local_5bc0._4_4_;
      fStack_5ba4 = (float)local_5bc0._4_4_;
      fVar11 = fVar4 - (float)local_5bc0._4_4_;
      local_5be0._0_4_ = local_5be0._4_4_;
      fStack_5bd8 = (float)local_5be0._4_4_;
      fStack_5bd4 = (float)local_5be0._4_4_;
      fStack_5bd0 = (float)local_5be0._4_4_;
      fStack_5bcc = (float)local_5be0._4_4_;
      fStack_5bc8 = (float)local_5be0._4_4_;
      fStack_5bc4 = (float)local_5be0._4_4_;
      fVar197 = fVar5 - (float)local_5be0._4_4_;
      local_5c00._0_4_ = local_5c00._4_4_;
      fStack_5bf8 = (float)local_5c00._4_4_;
      fStack_5bf4 = (float)local_5c00._4_4_;
      fStack_5bf0 = (float)local_5c00._4_4_;
      fStack_5bec = (float)local_5c00._4_4_;
      fStack_5be8 = (float)local_5c00._4_4_;
      fStack_5be4 = (float)local_5c00._4_4_;
      fVar199 = fVar6 - (float)local_5c00._4_4_;
      local_5c40._0_4_ = local_5c40._4_4_;
      fStack_5c38 = (float)local_5c40._4_4_;
      fStack_5c34 = (float)local_5c40._4_4_;
      fStack_5c30 = (float)local_5c40._4_4_;
      fStack_5c2c = (float)local_5c40._4_4_;
      fStack_5c28 = (float)local_5c40._4_4_;
      fStack_5c24 = (float)local_5c40._4_4_;
      fVar5 = (float)local_5c40._4_4_ - fVar5;
      fVar6 = local_5840 - fVar6;
      local_5c20._0_4_ = local_5c20._4_4_;
      fStack_5c18 = (float)local_5c20._4_4_;
      fStack_5c14 = (float)local_5c20._4_4_;
      fStack_5c10 = (float)local_5c20._4_4_;
      fStack_5c0c = (float)local_5c20._4_4_;
      fStack_5c08 = (float)local_5c20._4_4_;
      fStack_5c04 = (float)local_5c20._4_4_;
      fVar4 = (float)local_5c20._4_4_ - fVar4;
      local_5b70 = ZEXT416((uint)fVar199);
      local_5b90 = ZEXT416((uint)fVar11);
      local_5b80 = ZEXT416((uint)fVar197);
      local_5860 = vsubps_avx(auVar122,*(undefined1 (*) [32])(local_5d00 + 0x20));
      auVar91 = vsubps_avx(auVar126,*(undefined1 (*) [32])(local_5d00 + 0x40));
      local_5ac0._0_4_ = (float)uVar47;
      local_5ac0._4_4_ = (float)((ulong)uVar47 >> 0x20);
      uStack_5ab8._0_4_ = (float)uVar48;
      uStack_5ab8._4_4_ = (float)((ulong)uVar48 >> 0x20);
      uStack_5ab0._0_4_ = (float)uVar49;
      uStack_5ab0._4_4_ = (float)((ulong)uVar49 >> 0x20);
      uStack_5aa8._0_4_ = (float)uVar50;
      fVar123 = auVar91._0_4_;
      auVar152._0_4_ = fVar123 * (float)local_5ac0;
      fVar127 = auVar91._4_4_;
      auVar152._4_4_ = fVar127 * local_5ac0._4_4_;
      fVar128 = auVar91._8_4_;
      auVar152._8_4_ = fVar128 * (float)uStack_5ab8;
      fVar129 = auVar91._12_4_;
      auVar152._12_4_ = fVar129 * uStack_5ab8._4_4_;
      fVar130 = auVar91._16_4_;
      auVar152._16_4_ = fVar130 * (float)uStack_5ab0;
      fVar131 = auVar91._20_4_;
      auVar152._20_4_ = fVar131 * uStack_5ab0._4_4_;
      fVar132 = auVar91._24_4_;
      auVar152._24_4_ = fVar132 * (float)uStack_5aa8;
      auVar152._28_4_ = 0;
      local_5ae0._0_4_ = (float)uVar51;
      local_5ae0._4_4_ = (float)((ulong)uVar51 >> 0x20);
      uStack_5ad8._0_4_ = (float)uVar52;
      uStack_5ad8._4_4_ = (float)((ulong)uVar52 >> 0x20);
      uStack_5ad0._0_4_ = (float)uVar53;
      uStack_5ad0._4_4_ = (float)((ulong)uVar53 >> 0x20);
      fVar73 = local_5860._0_4_;
      auVar158._0_4_ = fVar73 * (float)local_5ae0;
      fVar83 = local_5860._4_4_;
      auVar158._4_4_ = fVar83 * local_5ae0._4_4_;
      fVar84 = local_5860._8_4_;
      auVar158._8_4_ = fVar84 * (float)uStack_5ad8;
      fVar85 = local_5860._12_4_;
      auVar158._12_4_ = fVar85 * uStack_5ad8._4_4_;
      fVar86 = local_5860._16_4_;
      auVar158._16_4_ = fVar86 * (float)uStack_5ad0;
      fVar87 = local_5860._20_4_;
      auVar158._20_4_ = fVar87 * uStack_5ad0._4_4_;
      fVar88 = local_5860._24_4_;
      auVar158._24_4_ = fVar88 * (float)uStack_5ac8;
      auVar158._28_4_ = 0;
      auVar119 = vsubps_avx(auVar158,auVar152);
      auVar91 = vsubps_avx(auVar138,*(undefined1 (*) [32])local_5d00);
      fVar133 = auVar91._0_4_;
      fVar99 = auVar91._4_4_;
      auVar28._4_4_ = fVar99 * local_5ae0._4_4_;
      auVar28._0_4_ = fVar133 * (float)local_5ae0;
      fVar113 = auVar91._8_4_;
      auVar28._8_4_ = fVar113 * (float)uStack_5ad8;
      fVar114 = auVar91._12_4_;
      auVar28._12_4_ = fVar114 * uStack_5ad8._4_4_;
      fVar115 = auVar91._16_4_;
      auVar28._16_4_ = fVar115 * (float)uStack_5ad0;
      fVar116 = auVar91._20_4_;
      auVar28._20_4_ = fVar116 * uStack_5ad0._4_4_;
      fVar117 = auVar91._24_4_;
      auVar28._24_4_ = fVar117 * (float)uStack_5ac8;
      auVar28._28_4_ = 0;
      fVar9 = auVar61._0_4_;
      auVar175._0_4_ = fVar123 * fVar9;
      fVar13 = auVar61._4_4_;
      auVar175._4_4_ = fVar127 * fVar13;
      fVar7 = auVar61._8_4_;
      auVar175._8_4_ = fVar128 * fVar7;
      fVar10 = auVar61._12_4_;
      auVar175._12_4_ = fVar129 * fVar10;
      fVar12 = auVar61._16_4_;
      auVar175._16_4_ = fVar130 * fVar12;
      fVar14 = auVar61._20_4_;
      auVar175._20_4_ = fVar131 * fVar14;
      fVar16 = (float)uStack_5ae8;
      auVar175._24_4_ = fVar132 * fVar16;
      auVar175._28_4_ = 0;
      auVar19 = vsubps_avx(auVar175,auVar28);
      auVar29._4_4_ = fVar83 * fVar13;
      auVar29._0_4_ = fVar73 * fVar9;
      auVar29._8_4_ = fVar84 * fVar7;
      auVar29._12_4_ = fVar85 * fVar10;
      auVar29._16_4_ = fVar86 * fVar12;
      auVar29._20_4_ = fVar87 * fVar14;
      auVar29._24_4_ = fVar88 * fVar16;
      auVar29._28_4_ = 0;
      auVar98._0_4_ = fVar133 * (float)local_5ac0;
      auVar98._4_4_ = fVar99 * local_5ac0._4_4_;
      auVar98._8_4_ = fVar113 * (float)uStack_5ab8;
      auVar98._12_4_ = fVar114 * uStack_5ab8._4_4_;
      auVar98._16_4_ = fVar115 * (float)uStack_5ab0;
      auVar98._20_4_ = fVar116 * uStack_5ab0._4_4_;
      auVar98._28_36_ = in_ZMM15._28_36_;
      auVar98._24_4_ = fVar117 * (float)uStack_5aa8;
      auVar20 = vsubps_avx(auVar98._0_32_,auVar29);
      auVar192 = ZEXT416((uint)(fVar6 * fVar11 - fVar4 * fVar199));
      auVar192 = vshufps_avx(auVar192,auVar192,0);
      auVar78._16_16_ = auVar192;
      auVar78._0_16_ = auVar192;
      auVar190 = ZEXT416((uint)(fVar197 * fVar4 - fVar11 * fVar5));
      auVar190 = vshufps_avx(auVar190,auVar190,0);
      fVar134 = auVar190._0_4_;
      fVar140 = auVar190._4_4_;
      fVar141 = auVar190._8_4_;
      fVar196 = auVar190._12_4_;
      auVar98 = ZEXT3264(auVar95);
      fVar11 = auVar192._0_4_;
      fVar15 = auVar192._4_4_;
      fVar8 = auVar192._8_4_;
      fVar194 = in_ZMM15._28_4_ + 0.0;
      auVar195 = ZEXT436((uint)fVar194);
      auVar190 = ZEXT416((uint)(fVar199 * fVar5 - fVar197 * fVar6));
      auVar190 = vshufps_avx(auVar190,auVar190,0);
      in_ZMM15 = ZEXT3264(CONCAT1616(auVar190,auVar190));
      fVar197 = auVar190._0_4_;
      fVar199 = auVar190._4_4_;
      fVar142 = auVar190._8_4_;
      auVar191._0_4_ = fVar197 * fVar9 + (float)local_5ac0 * fVar11 + fVar134 * (float)local_5ae0;
      auVar191._4_4_ = fVar199 * fVar13 + local_5ac0._4_4_ * fVar15 + fVar140 * local_5ae0._4_4_;
      auVar191._8_4_ = fVar142 * fVar7 + (float)uStack_5ab8 * fVar8 + fVar141 * (float)uStack_5ad8;
      auVar191._12_4_ =
           auVar190._12_4_ * fVar10 +
           uStack_5ab8._4_4_ * auVar192._12_4_ + fVar196 * uStack_5ad8._4_4_;
      auVar191._16_4_ =
           fVar197 * fVar12 + (float)uStack_5ab0 * fVar11 + fVar134 * (float)uStack_5ad0;
      auVar191._20_4_ = fVar199 * fVar14 + uStack_5ab0._4_4_ * fVar15 + fVar140 * uStack_5ad0._4_4_;
      auVar191._24_4_ = fVar142 * fVar16 + (float)uStack_5aa8 * fVar8 + fVar141 * (float)uStack_5ac8
      ;
      auVar191._28_4_ = fVar194 + 0.0;
      auVar89 = vshufps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0);
      auVar17 = vshufps_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),0);
      auVar18 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
      auVar149._8_4_ = 0x80000000;
      auVar149._0_8_ = 0x8000000080000000;
      auVar149._12_4_ = 0x80000000;
      auVar149._16_4_ = 0x80000000;
      auVar149._20_4_ = 0x80000000;
      auVar149._24_4_ = 0x80000000;
      auVar149._28_4_ = 0x80000000;
      auVar91 = vandps_avx(auVar191,auVar149);
      uVar174 = auVar91._0_4_;
      auVar154._0_4_ =
           (uint)(auVar18._0_4_ * auVar119._0_4_ +
                 auVar17._0_4_ * auVar20._0_4_ + auVar19._0_4_ * auVar89._0_4_) ^ uVar174;
      uVar178 = auVar91._4_4_;
      auVar154._4_4_ =
           (uint)(auVar18._4_4_ * auVar119._4_4_ +
                 auVar17._4_4_ * auVar20._4_4_ + auVar19._4_4_ * auVar89._4_4_) ^ uVar178;
      uVar180 = auVar91._8_4_;
      auVar154._8_4_ =
           (uint)(auVar18._8_4_ * auVar119._8_4_ +
                 auVar17._8_4_ * auVar20._8_4_ + auVar19._8_4_ * auVar89._8_4_) ^ uVar180;
      uVar182 = auVar91._12_4_;
      auVar154._12_4_ =
           (uint)(auVar18._12_4_ * auVar119._12_4_ +
                 auVar17._12_4_ * auVar20._12_4_ + auVar19._12_4_ * auVar89._12_4_) ^ uVar182;
      uVar184 = auVar91._16_4_;
      auVar154._16_4_ =
           (uint)(auVar18._0_4_ * auVar119._16_4_ +
                 auVar17._0_4_ * auVar20._16_4_ + auVar19._16_4_ * auVar89._0_4_) ^ uVar184;
      uVar186 = auVar91._20_4_;
      auVar154._20_4_ =
           (uint)(auVar18._4_4_ * auVar119._20_4_ +
                 auVar17._4_4_ * auVar20._20_4_ + auVar19._20_4_ * auVar89._4_4_) ^ uVar186;
      uVar188 = auVar91._24_4_;
      auVar154._24_4_ =
           (uint)(auVar18._8_4_ * auVar119._24_4_ +
                 auVar17._8_4_ * auVar20._24_4_ + auVar19._24_4_ * auVar89._8_4_) ^ uVar188;
      uVar189 = auVar91._28_4_;
      auVar154._28_4_ = (uint)(auVar18._12_4_ + auVar17._12_4_ + auVar89._12_4_) ^ uVar189;
      auVar91 = vcmpps_avx(auVar154,_DAT_01f7b000,5);
      auVar21 = auVar95 & auVar91;
      local_5b20._0_4_ = (float)uVar44;
      local_5b20._4_4_ = (float)((ulong)uVar44 >> 0x20);
      uStack_5b18._0_4_ = (float)uVar45;
      uStack_5b18._4_4_ = (float)((ulong)uVar45 >> 0x20);
      uStack_5b10._0_4_ = (float)uVar46;
      uStack_5b10._4_4_ = (float)((ulong)uVar46 >> 0x20);
      local_5b40._0_4_ = (float)uVar54;
      local_5b40._4_4_ = (float)((ulong)uVar54 >> 0x20);
      uStack_5b38._0_4_ = (float)uVar55;
      uStack_5b38._4_4_ = (float)((ulong)uVar55 >> 0x20);
      uStack_5b30._0_4_ = (float)uVar56;
      uStack_5b30._4_4_ = (float)((ulong)uVar56 >> 0x20);
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar89 = vpermilps_avx(local_5b90,0);
        auVar17 = vpermilps_avx(local_5b80,0);
        auVar195 = ZEXT436((uint)auVar17._12_4_);
        auVar18 = vpermilps_avx(local_5b70,0);
        auVar91 = vandps_avx(auVar91,auVar95);
        auVar105._0_4_ =
             uVar174 ^ (uint)(auVar89._0_4_ * auVar119._0_4_ +
                             auVar17._0_4_ * auVar19._0_4_ + auVar20._0_4_ * auVar18._0_4_);
        auVar105._4_4_ =
             uVar178 ^ (uint)(auVar89._4_4_ * auVar119._4_4_ +
                             auVar17._4_4_ * auVar19._4_4_ + auVar20._4_4_ * auVar18._4_4_);
        auVar105._8_4_ =
             uVar180 ^ (uint)(auVar89._8_4_ * auVar119._8_4_ +
                             auVar17._8_4_ * auVar19._8_4_ + auVar20._8_4_ * auVar18._8_4_);
        auVar105._12_4_ =
             uVar182 ^ (uint)(auVar89._12_4_ * auVar119._12_4_ +
                             auVar17._12_4_ * auVar19._12_4_ + auVar20._12_4_ * auVar18._12_4_);
        auVar105._16_4_ =
             uVar184 ^ (uint)(auVar89._0_4_ * auVar119._16_4_ +
                             auVar17._0_4_ * auVar19._16_4_ + auVar20._16_4_ * auVar18._0_4_);
        auVar105._20_4_ =
             uVar186 ^ (uint)(auVar89._4_4_ * auVar119._20_4_ +
                             auVar17._4_4_ * auVar19._20_4_ + auVar20._20_4_ * auVar18._4_4_);
        auVar105._24_4_ =
             uVar188 ^ (uint)(auVar89._8_4_ * auVar119._24_4_ +
                             auVar17._8_4_ * auVar19._24_4_ + auVar20._24_4_ * auVar18._8_4_);
        auVar105._28_4_ = uVar189 ^ (uint)(auVar112._28_4_ + auVar19._28_4_ + auVar18._12_4_);
        auVar119 = vcmpps_avx(auVar105,_DAT_01f7b000,5);
        auVar19 = auVar91 & auVar119;
        local_58e0 = auVar78;
        if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar19 >> 0x7f,0) != '\0') ||
              (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0xbf,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar19[0x1f] < '\0') {
          auVar81._8_4_ = 0x7fffffff;
          auVar81._0_8_ = 0x7fffffff7fffffff;
          auVar81._12_4_ = 0x7fffffff;
          auVar81._16_4_ = 0x7fffffff;
          auVar81._20_4_ = 0x7fffffff;
          auVar81._24_4_ = 0x7fffffff;
          auVar81._28_4_ = 0x7fffffff;
          auVar19 = vandps_avx(auVar191,auVar81);
          auVar91 = vandps_avx(auVar119,auVar91);
          auVar119 = vsubps_avx(auVar19,auVar154);
          auVar119 = vcmpps_avx(auVar119,auVar105,5);
          auVar20 = auVar91 & auVar119;
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0x7f,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar20 >> 0xbf,0) != '\0') ||
              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar20[0x1f] < '\0') {
            auVar91 = vandps_avx(auVar119,auVar91);
            auVar108._0_4_ =
                 uVar174 ^ (uint)(fVar197 * fVar133 + fVar134 * fVar123 + fVar73 * fVar11);
            auVar108._4_4_ =
                 uVar178 ^ (uint)(fVar199 * fVar99 + fVar140 * fVar127 + fVar83 * fVar15);
            auVar108._8_4_ =
                 uVar180 ^ (uint)(fVar142 * fVar113 + fVar141 * fVar128 + fVar84 * fVar8);
            auVar108._12_4_ =
                 uVar182 ^ (uint)(auVar190._12_4_ * fVar114 +
                                 fVar196 * fVar129 + fVar85 * auVar192._12_4_);
            auVar108._16_4_ =
                 uVar184 ^ (uint)(fVar197 * fVar115 + fVar134 * fVar130 + fVar86 * fVar11);
            auVar108._20_4_ =
                 uVar186 ^ (uint)(fVar199 * fVar116 + fVar140 * fVar131 + fVar87 * fVar15);
            auVar108._24_4_ =
                 uVar188 ^ (uint)(fVar142 * fVar117 + fVar141 * fVar132 + fVar88 * fVar8);
            auVar108._28_4_ =
                 uVar189 ^ (uint)((float)local_5860._28_4_ +
                                 auVar119._28_4_ + (float)local_5860._28_4_);
            auVar42._4_4_ = auVar19._4_4_ * local_5b20._4_4_;
            auVar42._0_4_ = auVar19._0_4_ * (float)local_5b20;
            auVar42._8_4_ = auVar19._8_4_ * (float)uStack_5b18;
            auVar42._12_4_ = auVar19._12_4_ * uStack_5b18._4_4_;
            auVar42._16_4_ = auVar19._16_4_ * (float)uStack_5b10;
            auVar42._20_4_ = auVar19._20_4_ * uStack_5b10._4_4_;
            auVar42._24_4_ = auVar19._24_4_ * (float)uStack_5b08;
            auVar42._28_4_ = local_5860._28_4_;
            auVar119 = vcmpps_avx(auVar42,auVar108,1);
            auVar43._4_4_ = auVar19._4_4_ * local_5b40._4_4_;
            auVar43._0_4_ = auVar19._0_4_ * (float)local_5b40;
            auVar43._8_4_ = auVar19._8_4_ * (float)uStack_5b38;
            auVar43._12_4_ = auVar19._12_4_ * uStack_5b38._4_4_;
            auVar43._16_4_ = auVar19._16_4_ * (float)uStack_5b30;
            auVar43._20_4_ = auVar19._20_4_ * uStack_5b30._4_4_;
            auVar43._24_4_ = auVar19._24_4_ * (float)uStack_5b28;
            auVar43._28_4_ = auVar19._28_4_;
            auVar19 = vcmpps_avx(auVar108,auVar43,2);
            auVar119 = vandps_avx(auVar19,auVar119);
            auVar19 = auVar91 & auVar119;
            if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0x7f,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar19 >> 0xbf,0) != '\0') ||
                (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar19[0x1f] < '\0') {
              auVar91 = vandps_avx(auVar119,auVar91);
              auVar119 = vcmpps_avx(auVar191,_DAT_01f7b000,4);
              auVar19 = auVar91 & auVar119;
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0x7f,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0xbf,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar19[0x1f] < '\0') {
                uVar174 = ((local_5cf0->scene->geometries).items[uVar69].ptr)->mask;
                auVar109._4_4_ = uVar174;
                auVar109._0_4_ = uVar174;
                auVar109._8_4_ = uVar174;
                auVar109._12_4_ = uVar174;
                auVar109._16_4_ = uVar174;
                auVar109._20_4_ = uVar174;
                auVar109._24_4_ = uVar174;
                auVar109._28_4_ = uVar174;
                auVar91 = vandps_avx(auVar119,auVar91);
                auVar119 = vandps_avx(auVar109,*(undefined1 (*) [32])pRVar1);
                auVar192 = vpcmpeqd_avx(auVar119._16_16_,ZEXT816(0) << 0x20);
                auVar190 = vpcmpeqd_avx(auVar119._0_16_,ZEXT816(0) << 0x20);
                auVar110._16_16_ = auVar192;
                auVar110._0_16_ = auVar91._0_16_;
                auVar119 = vblendps_avx(ZEXT1632(auVar190),auVar110,0xf0);
                auVar19 = auVar91 & ~auVar119;
                if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar19 >> 0x7f,0) != '\0') ||
                      (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0xbf,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar19[0x1f] < '\0') {
                  auVar91 = vandnps_avx(auVar119,auVar91);
                  auVar95 = vandnps_avx(auVar91,auVar95);
                  auVar98 = ZEXT3264(auVar95);
                  goto LAB_0102891e;
                }
              }
            }
          }
        }
        auVar98 = ZEXT3264(auVar95);
      }
LAB_0102891e:
      auVar95 = auVar98._0_32_;
      fStack_583c = local_5840;
      fStack_5838 = local_5840;
      fStack_5834 = local_5840;
      fStack_5830 = local_5840;
      fStack_582c = local_5840;
      fStack_5828 = local_5840;
      fStack_5824 = local_5840;
      if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar95 >> 0x7f,0) == '\0') &&
            (auVar98 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar95 >> 0xbf,0) == '\0') &&
          (auVar98 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) && -1 < auVar98[0x1f])
      break;
      uVar67 = *(undefined4 *)(lVar71 + -0x50 + (long)local_5c60);
      auVar104._4_4_ = uVar67;
      auVar104._0_4_ = uVar67;
      auVar104._8_4_ = uVar67;
      auVar104._12_4_ = uVar67;
      auVar104._16_4_ = uVar67;
      auVar104._20_4_ = uVar67;
      auVar104._24_4_ = uVar67;
      auVar104._28_4_ = uVar67;
      uVar67 = *(undefined4 *)((long)&local_5c60[-2].flags + lVar71);
      auVar139._4_4_ = uVar67;
      auVar139._0_4_ = uVar67;
      auVar139._8_4_ = uVar67;
      auVar139._12_4_ = uVar67;
      auVar139._16_4_ = uVar67;
      auVar139._20_4_ = uVar67;
      auVar139._24_4_ = uVar67;
      auVar139._28_4_ = uVar67;
      fVar4 = *(float *)(lVar71 + -0x30 + (long)local_5c60);
      auVar150._4_4_ = fVar4;
      auVar150._0_4_ = fVar4;
      auVar150._8_4_ = fVar4;
      auVar150._12_4_ = fVar4;
      auVar150._16_4_ = fVar4;
      auVar150._20_4_ = fVar4;
      auVar150._24_4_ = fVar4;
      auVar150._28_4_ = fVar4;
      auVar119 = vsubps_avx(auVar104,_local_5c20);
      auVar19 = vsubps_avx(auVar139,_local_5c40);
      auVar60._4_4_ = local_5840;
      auVar60._0_4_ = local_5840;
      auVar60._8_4_ = local_5840;
      auVar60._12_4_ = local_5840;
      auVar60._16_4_ = local_5840;
      auVar60._20_4_ = local_5840;
      auVar60._24_4_ = local_5840;
      auVar60._28_4_ = local_5840;
      auVar20 = vsubps_avx(auVar150,auVar60);
      auVar21 = vsubps_avx(_local_5bc0,auVar104);
      auVar75 = vsubps_avx(_local_5be0,auVar139);
      auVar91 = vsubps_avx(_local_5c00,auVar150);
      fVar5 = auVar19._0_4_;
      fVar198 = auVar91._0_4_;
      fVar13 = auVar19._4_4_;
      fVar200 = auVar91._4_4_;
      auVar30._4_4_ = fVar200 * fVar13;
      auVar30._0_4_ = fVar198 * fVar5;
      fVar10 = auVar19._8_4_;
      fVar201 = auVar91._8_4_;
      auVar30._8_4_ = fVar201 * fVar10;
      fVar199 = auVar19._12_4_;
      fVar202 = auVar91._12_4_;
      auVar30._12_4_ = fVar202 * fVar199;
      fVar85 = auVar19._16_4_;
      fVar203 = auVar91._16_4_;
      auVar30._16_4_ = fVar203 * fVar85;
      fVar123 = auVar19._20_4_;
      fVar204 = auVar91._20_4_;
      auVar30._20_4_ = fVar204 * fVar123;
      fVar130 = auVar19._24_4_;
      fVar205 = auVar91._24_4_;
      auVar30._24_4_ = fVar205 * fVar130;
      auVar30._28_4_ = local_5c00._4_4_;
      fVar6 = auVar20._0_4_;
      fVar173 = auVar75._0_4_;
      auVar112._0_4_ = fVar173 * fVar6;
      fVar15 = auVar20._4_4_;
      fVar177 = auVar75._4_4_;
      auVar112._4_4_ = fVar177 * fVar15;
      fVar12 = auVar20._8_4_;
      fVar179 = auVar75._8_4_;
      auVar112._8_4_ = fVar179 * fVar12;
      fVar73 = auVar20._12_4_;
      fVar181 = auVar75._12_4_;
      auVar112._12_4_ = fVar181 * fVar73;
      fVar86 = auVar20._16_4_;
      fVar183 = auVar75._16_4_;
      auVar112._16_4_ = fVar183 * fVar86;
      fVar127 = auVar20._20_4_;
      fVar185 = auVar75._20_4_;
      auVar112._20_4_ = fVar185 * fVar127;
      fVar131 = auVar20._24_4_;
      auVar112._28_36_ = auVar98._28_36_;
      fVar187 = auVar75._24_4_;
      auVar112._24_4_ = fVar187 * fVar131;
      auVar120 = vsubps_avx(auVar112._0_32_,auVar30);
      fVar165 = auVar21._0_4_;
      fVar167 = auVar21._4_4_;
      auVar31._4_4_ = fVar167 * fVar15;
      auVar31._0_4_ = fVar165 * fVar6;
      fVar168 = auVar21._8_4_;
      auVar31._8_4_ = fVar168 * fVar12;
      fVar169 = auVar21._12_4_;
      auVar31._12_4_ = fVar169 * fVar73;
      fVar170 = auVar21._16_4_;
      auVar31._16_4_ = fVar170 * fVar86;
      fVar171 = auVar21._20_4_;
      auVar31._20_4_ = fVar171 * fVar127;
      fVar133 = auVar98._28_4_;
      fVar172 = auVar21._24_4_;
      auVar31._24_4_ = fVar172 * fVar131;
      auVar31._28_4_ = fVar133;
      fVar9 = auVar119._0_4_;
      fVar7 = auVar119._4_4_;
      auVar32._4_4_ = fVar200 * fVar7;
      auVar32._0_4_ = fVar198 * fVar9;
      fVar14 = auVar119._8_4_;
      auVar32._8_4_ = fVar201 * fVar14;
      fVar83 = auVar119._12_4_;
      auVar32._12_4_ = fVar202 * fVar83;
      fVar87 = auVar119._16_4_;
      auVar32._16_4_ = fVar203 * fVar87;
      fVar128 = auVar119._20_4_;
      auVar32._20_4_ = fVar204 * fVar128;
      fVar132 = auVar119._24_4_;
      auVar32._24_4_ = fVar205 * fVar132;
      auVar32._28_4_ = auVar20._28_4_;
      _local_5c20 = vsubps_avx(auVar32,auVar31);
      auVar33._4_4_ = fVar177 * fVar7;
      auVar33._0_4_ = fVar173 * fVar9;
      auVar33._8_4_ = fVar179 * fVar14;
      auVar33._12_4_ = fVar181 * fVar83;
      auVar33._16_4_ = fVar183 * fVar87;
      auVar33._20_4_ = fVar185 * fVar128;
      auVar33._24_4_ = fVar187 * fVar132;
      auVar33._28_4_ = auVar20._28_4_;
      auVar34._4_4_ = fVar167 * fVar13;
      auVar34._0_4_ = fVar165 * fVar5;
      auVar34._8_4_ = fVar168 * fVar10;
      auVar34._12_4_ = fVar169 * fVar199;
      auVar34._16_4_ = fVar170 * fVar85;
      auVar34._20_4_ = fVar171 * fVar123;
      auVar34._24_4_ = fVar172 * fVar130;
      auVar34._28_4_ = auVar119._28_4_;
      _local_5c40 = vsubps_avx(auVar34,auVar33);
      auVar121 = vsubps_avx(auVar104,*(undefined1 (*) [32])local_5d00);
      auVar91 = vsubps_avx(auVar139,*(undefined1 (*) [32])(local_5d00 + 0x20));
      auVar125 = vsubps_avx(auVar150,*(undefined1 (*) [32])(local_5d00 + 0x40));
      uStack_5aa8._4_4_ = (float)((ulong)uVar50 >> 0x20);
      fVar156 = auVar125._0_4_;
      fVar159 = auVar125._4_4_;
      auVar35._4_4_ = fVar159 * local_5ac0._4_4_;
      auVar35._0_4_ = fVar156 * (float)local_5ac0;
      fVar160 = auVar125._8_4_;
      auVar35._8_4_ = fVar160 * (float)uStack_5ab8;
      fVar161 = auVar125._12_4_;
      auVar35._12_4_ = fVar161 * uStack_5ab8._4_4_;
      fVar162 = auVar125._16_4_;
      auVar35._16_4_ = fVar162 * (float)uStack_5ab0;
      fVar163 = auVar125._20_4_;
      auVar35._20_4_ = fVar163 * uStack_5ab0._4_4_;
      fVar164 = auVar125._24_4_;
      auVar35._24_4_ = fVar164 * (float)uStack_5aa8;
      auVar35._28_4_ = fVar4;
      fVar134 = auVar91._0_4_;
      fVar140 = auVar91._4_4_;
      auVar36._4_4_ = fVar140 * local_5ae0._4_4_;
      auVar36._0_4_ = fVar134 * (float)local_5ae0;
      fVar141 = auVar91._8_4_;
      auVar36._8_4_ = fVar141 * (float)uStack_5ad8;
      fVar142 = auVar91._12_4_;
      auVar36._12_4_ = fVar142 * uStack_5ad8._4_4_;
      fVar143 = auVar91._16_4_;
      auVar36._16_4_ = fVar143 * (float)uStack_5ad0;
      fVar144 = auVar91._20_4_;
      auVar36._20_4_ = fVar144 * uStack_5ad0._4_4_;
      fVar145 = auVar91._24_4_;
      auVar36._24_4_ = fVar145 * (float)uStack_5ac8;
      auVar36._28_4_ = auVar19._28_4_;
      auVar125 = vsubps_avx(auVar36,auVar35);
      fVar99 = auVar121._0_4_;
      fVar113 = auVar121._4_4_;
      auVar37._4_4_ = fVar113 * local_5ae0._4_4_;
      auVar37._0_4_ = fVar99 * (float)local_5ae0;
      fVar114 = auVar121._8_4_;
      auVar37._8_4_ = fVar114 * (float)uStack_5ad8;
      fVar115 = auVar121._12_4_;
      auVar37._12_4_ = fVar115 * uStack_5ad8._4_4_;
      fVar116 = auVar121._16_4_;
      auVar37._16_4_ = fVar116 * (float)uStack_5ad0;
      fVar117 = auVar121._20_4_;
      auVar37._20_4_ = fVar117 * uStack_5ad0._4_4_;
      fVar194 = auVar121._24_4_;
      auVar37._24_4_ = fVar194 * (float)uStack_5ac8;
      auVar37._28_4_ = fVar4;
      fVar11 = auVar62._0_4_;
      auVar193._0_4_ = fVar156 * fVar11;
      fVar8 = auVar62._4_4_;
      auVar193._4_4_ = fVar159 * fVar8;
      fVar197 = auVar62._8_4_;
      auVar193._8_4_ = fVar160 * fVar197;
      fVar84 = auVar62._12_4_;
      auVar193._12_4_ = fVar161 * fVar84;
      fVar88 = auVar62._16_4_;
      auVar193._16_4_ = fVar162 * fVar88;
      fVar129 = auVar62._20_4_;
      auVar193._20_4_ = fVar163 * fVar129;
      auVar193._24_4_ = fVar164 * fVar16;
      auVar193._28_36_ = auVar195;
      auVar136 = vsubps_avx(auVar193._0_32_,auVar37);
      auVar38._4_4_ = fVar140 * fVar8;
      auVar38._0_4_ = fVar134 * fVar11;
      auVar38._8_4_ = fVar141 * fVar197;
      auVar38._12_4_ = fVar142 * fVar84;
      auVar38._16_4_ = fVar143 * fVar88;
      auVar38._20_4_ = fVar144 * fVar129;
      auVar38._24_4_ = fVar145 * fVar16;
      auVar38._28_4_ = fVar4;
      auVar39._4_4_ = fVar113 * local_5ac0._4_4_;
      auVar39._0_4_ = fVar99 * (float)local_5ac0;
      auVar39._8_4_ = fVar114 * (float)uStack_5ab8;
      auVar39._12_4_ = fVar115 * uStack_5ab8._4_4_;
      auVar39._16_4_ = fVar116 * (float)uStack_5ab0;
      auVar39._20_4_ = fVar117 * uStack_5ab0._4_4_;
      auVar39._24_4_ = fVar194 * (float)uStack_5aa8;
      auVar39._28_4_ = fVar196;
      auVar137 = vsubps_avx(auVar39,auVar38);
      auVar151._0_4_ =
           auVar120._0_4_ * fVar11 +
           local_5c20._0_4_ * (float)local_5ac0 + local_5c40._0_4_ * (float)local_5ae0;
      auVar151._4_4_ =
           auVar120._4_4_ * fVar8 +
           local_5c20._4_4_ * local_5ac0._4_4_ + local_5c40._4_4_ * local_5ae0._4_4_;
      auVar151._8_4_ =
           auVar120._8_4_ * fVar197 +
           local_5c20._8_4_ * (float)uStack_5ab8 + local_5c40._8_4_ * (float)uStack_5ad8;
      auVar151._12_4_ =
           auVar120._12_4_ * fVar84 +
           local_5c20._12_4_ * uStack_5ab8._4_4_ + local_5c40._12_4_ * uStack_5ad8._4_4_;
      auVar151._16_4_ =
           auVar120._16_4_ * fVar88 +
           local_5c20._16_4_ * (float)uStack_5ab0 + local_5c40._16_4_ * (float)uStack_5ad0;
      auVar151._20_4_ =
           auVar120._20_4_ * fVar129 +
           local_5c20._20_4_ * uStack_5ab0._4_4_ + local_5c40._20_4_ * uStack_5ad0._4_4_;
      auVar151._24_4_ =
           auVar120._24_4_ * fVar16 +
           local_5c20._24_4_ * (float)uStack_5aa8 + local_5c40._24_4_ * (float)uStack_5ac8;
      auVar151._28_4_ = fVar4 + uStack_5aa8._4_4_ + fVar4;
      auVar176._8_4_ = 0x80000000;
      auVar176._0_8_ = 0x8000000080000000;
      auVar176._12_4_ = 0x80000000;
      auVar176._16_4_ = 0x80000000;
      auVar176._20_4_ = 0x80000000;
      auVar176._24_4_ = 0x80000000;
      auVar176._28_4_ = 0x80000000;
      auVar91 = vandps_avx(auVar176,auVar151);
      uVar174 = auVar91._0_4_;
      auVar166._0_4_ =
           uVar174 ^ (uint)(fVar165 * auVar125._0_4_ +
                           fVar173 * auVar136._0_4_ + fVar198 * auVar137._0_4_);
      uVar178 = auVar91._4_4_;
      auVar166._4_4_ =
           uVar178 ^ (uint)(fVar167 * auVar125._4_4_ +
                           fVar177 * auVar136._4_4_ + fVar200 * auVar137._4_4_);
      uVar180 = auVar91._8_4_;
      auVar166._8_4_ =
           uVar180 ^ (uint)(fVar168 * auVar125._8_4_ +
                           fVar179 * auVar136._8_4_ + fVar201 * auVar137._8_4_);
      uVar182 = auVar91._12_4_;
      auVar166._12_4_ =
           uVar182 ^ (uint)(fVar169 * auVar125._12_4_ +
                           fVar181 * auVar136._12_4_ + fVar202 * auVar137._12_4_);
      uVar184 = auVar91._16_4_;
      auVar166._16_4_ =
           uVar184 ^ (uint)(fVar170 * auVar125._16_4_ +
                           fVar183 * auVar136._16_4_ + fVar203 * auVar137._16_4_);
      uVar186 = auVar91._20_4_;
      auVar166._20_4_ =
           uVar186 ^ (uint)(fVar171 * auVar125._20_4_ +
                           fVar185 * auVar136._20_4_ + fVar204 * auVar137._20_4_);
      uVar188 = auVar91._24_4_;
      auVar166._24_4_ =
           uVar188 ^ (uint)(fVar172 * auVar125._24_4_ +
                           fVar187 * auVar136._24_4_ + fVar205 * auVar137._24_4_);
      uVar189 = auVar91._28_4_;
      auVar166._28_4_ =
           uVar189 ^ (uint)(auVar21._28_4_ + auVar75._28_4_ + uStack_5aa8._4_4_ + fVar4);
      auVar91 = vcmpps_avx(auVar166,_DAT_01f7b000,5);
      in_ZMM15 = ZEXT3264(auVar91);
      auVar21 = auVar95 & auVar91;
      _local_5c00 = auVar20;
      _local_5be0 = auVar19;
      _local_5bc0 = auVar119;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0x7f,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0xbf,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
      {
        auVar112 = ZEXT3264(auVar95);
      }
      else {
        auVar112 = ZEXT3264(auVar95);
        auVar91 = vandps_avx(auVar91,auVar95);
        in_ZMM15 = ZEXT3264(auVar91);
        auVar155._0_4_ =
             uVar174 ^ (uint)(auVar125._0_4_ * fVar9 +
                             auVar136._0_4_ * fVar5 + auVar137._0_4_ * fVar6);
        auVar155._4_4_ =
             uVar178 ^ (uint)(auVar125._4_4_ * fVar7 +
                             auVar136._4_4_ * fVar13 + auVar137._4_4_ * fVar15);
        auVar155._8_4_ =
             uVar180 ^ (uint)(auVar125._8_4_ * fVar14 +
                             auVar136._8_4_ * fVar10 + auVar137._8_4_ * fVar12);
        auVar155._12_4_ =
             uVar182 ^ (uint)(auVar125._12_4_ * fVar83 +
                             auVar136._12_4_ * fVar199 + auVar137._12_4_ * fVar73);
        auVar155._16_4_ =
             uVar184 ^ (uint)(auVar125._16_4_ * fVar87 +
                             auVar136._16_4_ * fVar85 + auVar137._16_4_ * fVar86);
        auVar155._20_4_ =
             uVar186 ^ (uint)(auVar125._20_4_ * fVar128 +
                             auVar136._20_4_ * fVar123 + auVar137._20_4_ * fVar127);
        auVar155._24_4_ =
             uVar188 ^ (uint)(auVar125._24_4_ * fVar132 +
                             auVar136._24_4_ * fVar130 + auVar137._24_4_ * fVar131);
        auVar155._28_4_ = uVar189 ^ (uint)(auVar120._28_4_ + local_5c20._28_4_ + fVar133);
        auVar119 = vcmpps_avx(auVar155,_DAT_01f7b000,5);
        auVar19 = auVar91 & auVar119;
        if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar19 >> 0x7f,0) != '\0') ||
              (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0xbf,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar19[0x1f] < '\0') {
          auVar79._8_4_ = 0x7fffffff;
          auVar79._0_8_ = 0x7fffffff7fffffff;
          auVar79._12_4_ = 0x7fffffff;
          auVar79._16_4_ = 0x7fffffff;
          auVar79._20_4_ = 0x7fffffff;
          auVar79._24_4_ = 0x7fffffff;
          auVar79._28_4_ = 0x7fffffff;
          auVar19 = vandps_avx(auVar151,auVar79);
          auVar91 = vandps_avx(auVar119,auVar91);
          auVar20 = vsubps_avx(auVar19,auVar166);
          auVar119 = vcmpps_avx(auVar20,auVar155,5);
          auVar21 = auVar91 & auVar119;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0x7f,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar21 >> 0xbf,0) != '\0') ||
              (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar21[0x1f] < '\0') {
            auVar91 = vandps_avx(auVar119,auVar91);
            auVar80._0_4_ =
                 uVar174 ^ (uint)(fVar99 * auVar120._0_4_ +
                                 fVar156 * local_5c40._0_4_ + fVar134 * local_5c20._0_4_);
            auVar80._4_4_ =
                 uVar178 ^ (uint)(fVar113 * auVar120._4_4_ +
                                 fVar159 * local_5c40._4_4_ + fVar140 * local_5c20._4_4_);
            auVar80._8_4_ =
                 uVar180 ^ (uint)(fVar114 * auVar120._8_4_ +
                                 fVar160 * local_5c40._8_4_ + fVar141 * local_5c20._8_4_);
            auVar80._12_4_ =
                 uVar182 ^ (uint)(fVar115 * auVar120._12_4_ +
                                 fVar161 * local_5c40._12_4_ + fVar142 * local_5c20._12_4_);
            auVar80._16_4_ =
                 uVar184 ^ (uint)(fVar116 * auVar120._16_4_ +
                                 fVar162 * local_5c40._16_4_ + fVar143 * local_5c20._16_4_);
            auVar80._20_4_ =
                 uVar186 ^ (uint)(fVar117 * auVar120._20_4_ +
                                 fVar163 * local_5c40._20_4_ + fVar144 * local_5c20._20_4_);
            auVar80._24_4_ =
                 uVar188 ^ (uint)(fVar194 * auVar120._24_4_ +
                                 fVar164 * local_5c40._24_4_ + fVar145 * local_5c20._24_4_);
            auVar80._28_4_ = uVar189 ^ (uint)(fVar133 + auVar20._28_4_ + fVar133);
            auVar40._4_4_ = auVar19._4_4_ * local_5b20._4_4_;
            auVar40._0_4_ = auVar19._0_4_ * (float)local_5b20;
            auVar40._8_4_ = auVar19._8_4_ * (float)uStack_5b18;
            auVar40._12_4_ = auVar19._12_4_ * uStack_5b18._4_4_;
            auVar40._16_4_ = auVar19._16_4_ * (float)uStack_5b10;
            auVar40._20_4_ = auVar19._20_4_ * uStack_5b10._4_4_;
            auVar40._24_4_ = auVar19._24_4_ * (float)uStack_5b08;
            auVar40._28_4_ = fVar133;
            auVar119 = vcmpps_avx(auVar40,auVar80,1);
            auVar41._4_4_ = auVar19._4_4_ * local_5b40._4_4_;
            auVar41._0_4_ = auVar19._0_4_ * (float)local_5b40;
            auVar41._8_4_ = auVar19._8_4_ * (float)uStack_5b38;
            auVar41._12_4_ = auVar19._12_4_ * uStack_5b38._4_4_;
            auVar41._16_4_ = auVar19._16_4_ * (float)uStack_5b30;
            auVar41._20_4_ = auVar19._20_4_ * uStack_5b30._4_4_;
            auVar41._24_4_ = auVar19._24_4_ * (float)uStack_5b28;
            auVar41._28_4_ = auVar121._28_4_;
            auVar19 = vcmpps_avx(auVar80,auVar41,2);
            auVar119 = vandps_avx(auVar19,auVar119);
            auVar19 = auVar91 & auVar119;
            if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0x7f,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar19 >> 0xbf,0) != '\0') ||
                (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar19[0x1f] < '\0') {
              auVar91 = vandps_avx(auVar91,auVar119);
              auVar119 = vcmpps_avx(auVar151,_DAT_01f7b000,4);
              auVar19 = auVar91 & auVar119;
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0x7f,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0xbf,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar19[0x1f] < '\0') {
                uVar174 = ((local_5cf0->scene->geometries).items[uVar69].ptr)->mask;
                auVar106._4_4_ = uVar174;
                auVar106._0_4_ = uVar174;
                auVar106._8_4_ = uVar174;
                auVar106._12_4_ = uVar174;
                auVar106._16_4_ = uVar174;
                auVar106._20_4_ = uVar174;
                auVar106._24_4_ = uVar174;
                auVar106._28_4_ = uVar174;
                auVar91 = vandps_avx(auVar119,auVar91);
                auVar119 = vandps_avx(auVar106,*(undefined1 (*) [32])pRVar1);
                auVar192 = vpcmpeqd_avx(auVar119._16_16_,ZEXT816(0) << 0x20);
                auVar190 = vpcmpeqd_avx(auVar119._0_16_,ZEXT816(0) << 0x20);
                auVar107._16_16_ = auVar192;
                auVar107._0_16_ = auVar91._0_16_;
                auVar119 = vblendps_avx(ZEXT1632(auVar190),auVar107,0xf0);
                auVar19 = auVar91 & ~auVar119;
                if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar19 >> 0x7f,0) != '\0') ||
                      (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0xbf,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar19[0x1f] < '\0') {
                  auVar91 = vandnps_avx(auVar119,auVar91);
                  auVar119 = vandnps_avx(auVar91,auVar95);
                  auVar91 = auVar95 & ~auVar91;
                  auVar112 = ZEXT3264(auVar119);
                  auVar95 = auVar119;
                  if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar91 >> 0x7f,0) != '\0') ||
                        (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar91 >> 0xbf,0) != '\0') ||
                      (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar91[0x1f] < '\0') goto LAB_01028a91;
                  break;
                }
              }
            }
            auVar112 = ZEXT3264(auVar95);
          }
        }
      }
LAB_01028a91:
      local_5c60 = (RTCIntersectArguments *)&local_5c60->feature_mask;
    }
    auVar112 = ZEXT3264(local_5cc0);
    auVar192 = local_5cc0._0_16_;
    auVar91 = vandps_avx(auVar95,local_5cc0);
    lVar66 = lVar66 + 1;
    lVar71 = lVar71 + 0xe0;
    auVar95 = local_5cc0 & auVar95;
    local_5cc0 = auVar91;
  } while ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(auVar95 >> 0x7f,0) != '\0') ||
             (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(auVar95 >> 0xbf,0) != '\0') ||
           (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           auVar95[0x1f] < '\0');
  auVar82._0_8_ = local_5cc0._0_8_ ^ 0xffffffffffffffff;
  auVar82._8_4_ = local_5cc0._8_4_ ^ 0xffffffff;
  auVar82._12_4_ = local_5cc0._12_4_ ^ 0xffffffff;
  auVar82._16_4_ = local_5cc0._16_4_ ^ 0xffffffff;
  auVar82._20_4_ = local_5cc0._20_4_ ^ 0xffffffff;
  auVar82._24_4_ = local_5cc0._24_4_ ^ 0xffffffff;
  auVar82._28_4_ = local_5cc0._28_4_ ^ 0xffffffff;
  _local_5ce0 = vorps_avx(auVar82,_local_5ce0);
  auVar192 = vpcmpeqd_avx(auVar192,auVar192);
  auVar190 = vpcmpgtd_avx(local_5ce0._16_16_,auVar192);
  auVar192 = vpcmpgtd_avx(local_5ce0._0_16_,auVar192);
  auVar192 = vpor_avx(auVar192,auVar190);
  if ((((auVar192 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar192 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar192 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar192[0xf])
  goto LAB_01028f00;
  auVar96._8_4_ = 0xff800000;
  auVar96._0_8_ = 0xff800000ff800000;
  auVar96._12_4_ = 0xff800000;
  auVar96._16_4_ = 0xff800000;
  auVar96._20_4_ = 0xff800000;
  auVar96._24_4_ = 0xff800000;
  auVar96._28_4_ = 0xff800000;
  auVar112 = ZEXT3264(local_5900);
  local_5900 = vblendvps_avx(local_5900,auVar96,_local_5ce0);
  local_5b40 = uVar54;
  uStack_5b38 = uVar55;
  uStack_5b30 = uVar56;
  local_5b20 = uVar44;
  uStack_5b18 = uVar45;
  uStack_5b10 = uVar46;
  local_5ae0 = uVar51;
  uStack_5ad8 = uVar52;
  uStack_5ad0 = uVar53;
  local_5ac0 = uVar47;
  uStack_5ab8 = uVar48;
  uStack_5ab0 = uVar49;
  uStack_5aa8 = uVar50;
  goto LAB_0102839e;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }